

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes2Context.cpp
# Opt level: O0

void __thiscall deqp::gles2::Context::Context(Context *this,TestContext *testCtx)

{
  ApiType apiType;
  int iVar1;
  Platform *platform;
  CommandLine *cmdLine;
  RenderContext *pRVar2;
  ContextInfo *pCVar3;
  undefined4 extraout_var;
  TestContext *testCtx_local;
  Context *this_local;
  
  this->m_testCtx = testCtx;
  this->m_renderCtx = (RenderContext *)0x0;
  this->m_contextInfo = (ContextInfo *)0x0;
  platform = tcu::TestContext::getPlatform(this->m_testCtx);
  cmdLine = tcu::TestContext::getCommandLine(this->m_testCtx);
  apiType = glu::ApiType::es(2,0);
  pRVar2 = glu::createDefaultRenderContext(platform,cmdLine,apiType);
  this->m_renderCtx = pRVar2;
  pCVar3 = glu::ContextInfo::create(this->m_renderCtx);
  this->m_contextInfo = pCVar3;
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  glw::setCurrentThreadFunctions((Functions *)CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

Context::Context (tcu::TestContext& testCtx)
	: m_testCtx		(testCtx)
	, m_renderCtx	(DE_NULL)
	, m_contextInfo	(DE_NULL)
{
	try
	{
		m_renderCtx		= glu::createDefaultRenderContext(m_testCtx.getPlatform(), m_testCtx.getCommandLine(), glu::ApiType::es(2,0));
		m_contextInfo	= glu::ContextInfo::create(*m_renderCtx);

		// Set up function table for transparent wrapper.
		glw::setCurrentThreadFunctions(&m_renderCtx->getFunctions());
	}
	catch (...)
	{
		glw::setCurrentThreadFunctions(DE_NULL);

		delete m_contextInfo;
		delete m_renderCtx;

		throw;
	}
}